

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avsd_vdpu2.c
# Opt level: O0

MPP_RET hal_avsd_vdpu2_wait(void *decoder,HalTaskInfo *task)

{
  MPP_RET MVar1;
  HalTaskInfo *local_40;
  DecCbHalDone param;
  AvsdHalCtx_t *p_hal;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *decoder_local;
  
  param._16_8_ = decoder;
  if ((avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_vdpu2","In.","hal_avsd_vdpu2_wait");
  }
  if ((((((task->dec).flags.val >> 2 & 1) == 0) && (((task->dec).flags.val >> 3 & 1) == 0)) ||
      (*(int *)(*(long *)(param._16_8_ + 0x88) + 0x30) != 0)) &&
     (MVar1 = mpp_dev_ioctl(*(MppDev *)(param._16_8_ + 0x80),0x10,(void *)0x0), MVar1 != MPP_OK)) {
    _mpp_log_l(2,"hal_avsd_vdpu2","poll cmd failed %d\n","hal_avsd_vdpu2_wait",(ulong)(uint)MVar1);
  }
  if (*(long *)(param._16_8_ + 0x78) != 0) {
    param.task = *(void **)(param._16_8_ + 0x1a0);
    param.regs._1_3_ = 0;
    param.regs._0_1_ = (*(uint *)(*(long *)(param._16_8_ + 0x1a0) + 0xdc) >> 4 & 1) == 0;
    local_40 = task;
    mpp_callback_f("hal_avsd_vdpu2_wait",*(MppCbCtx **)(param._16_8_ + 0x78),&local_40);
    if ((avsd_hal_debug & 0x20) != 0) {
      _mpp_log_l(4,"hal_avsd_vdpu2","reg[55]=%08x, ref=%d, dpberr=%d, harderr=%d\n",(char *)0x0,
                 (ulong)*(uint *)(*(long *)(param._16_8_ + 0x1a0) + 0xdc),
                 (ulong)((uint)((task->dec).flags.val >> 4) & 1),
                 (uint)((task->dec).flags.val >> 3) & 1,(uint)param.regs);
    }
  }
  update_parameters((AvsdHalCtx_t *)param._16_8_);
  memset((void *)(*(long *)(param._16_8_ + 0x1a0) + 0xdc),0,4);
  if (((*(int *)(param._16_8_ + 0x1fc) == 0) && (*(int *)(param._16_8_ + 0xf4) == 0)) &&
     (((((task->dec).flags.val >> 2 & 1) == 0 && (((task->dec).flags.val >> 3 & 1) == 0)) ||
      (*(int *)(*(long *)(param._16_8_ + 0x88) + 0x30) != 0)))) {
    repeat_other_field((AvsdHalCtx_t *)param._16_8_,task);
  }
  *(int *)(param._16_8_ + 0x21c) = *(int *)(param._16_8_ + 0x21c) + 1;
  if ((avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_vdpu2","Out.","hal_avsd_vdpu2_wait");
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_avsd_vdpu2_wait(void *decoder, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    AvsdHalCtx_t *p_hal = (AvsdHalCtx_t *)decoder;

    AVSD_HAL_TRACE("In.");

    if ((task->dec.flags.parse_err || task->dec.flags.ref_err) &&
        !p_hal->dec_cfg->base.disable_error) {
        goto __SKIP_HARD;
    }

    ret = mpp_dev_ioctl(p_hal->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);

__SKIP_HARD:
    if (p_hal->dec_cb) {
        DecCbHalDone param;

        param.task = (void *)&task->dec;
        param.regs = (RK_U32 *)p_hal->p_regs;

        if (!((AvsdVdpu2Regs_t *)p_hal->p_regs)->sw55.dec_rdy_sts) {
            param.hard_err = 1;
        } else
            param.hard_err = 0;

        mpp_callback(p_hal->dec_cb, &param);
        AVSD_HAL_DBG(AVSD_HAL_DBG_WAIT, "reg[55]=%08x, ref=%d, dpberr=%d, harderr=%d\n",
                     p_hal->p_regs[55], task->dec.flags.used_for_ref, task->dec.flags.ref_err, param.hard_err);
    }

    update_parameters(p_hal);
    memset(&p_hal->p_regs[55], 0, sizeof(RK_U32));
    if (!p_hal->first_field && p_hal->syn.pp.pictureStructure == FIELDPICTURE &&
        ((!task->dec.flags.parse_err && !task->dec.flags.ref_err) ||
         p_hal->dec_cfg->base.disable_error)) {
        repeat_other_field(p_hal, task);
    }
    p_hal->frame_no++;

    AVSD_HAL_TRACE("Out.");
    return ret = MPP_OK;
}